

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  ImFontConfig *pIVar1;
  ImFont **ppIVar2;
  long in_RDI;
  int i_1;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int i_00;
  int i_01;
  
  for (i_01 = 0; i_01 < *(int *)(in_RDI + 0x60); i_01 = i_01 + 1) {
    pIVar1 = ImVector<ImFontConfig>::operator[]((ImVector<ImFontConfig> *)(in_RDI + 0x60),i_01);
    if (pIVar1->FontData != (void *)0x0) {
      pIVar1 = ImVector<ImFontConfig>::operator[]((ImVector<ImFontConfig> *)(in_RDI + 0x60),i_01);
      if ((pIVar1->FontDataOwnedByAtlas & 1U) != 0) {
        ImVector<ImFontConfig>::operator[]((ImVector<ImFontConfig> *)(in_RDI + 0x60),i_01);
        ImGui::MemFree((void *)CONCAT44(i_01,in_stack_fffffffffffffff0));
        pIVar1 = ImVector<ImFontConfig>::operator[]((ImVector<ImFontConfig> *)(in_RDI + 0x60),i_01);
        pIVar1->FontData = (void *)0x0;
      }
    }
  }
  for (i_00 = 0; i_00 < *(int *)(in_RDI + 0x40); i_00 = i_00 + 1) {
    ppIVar2 = ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)(in_RDI + 0x40),i_00);
    if (*(ImFontConfig **)(in_RDI + 0x68) <= (*ppIVar2)->ConfigData) {
      ppIVar2 = ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)(in_RDI + 0x40),i_00);
      if ((*ppIVar2)->ConfigData <
          (ImFontConfig *)(*(long *)(in_RDI + 0x68) + (long)*(int *)(in_RDI + 0x60) * 0x88)) {
        ppIVar2 = ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)(in_RDI + 0x40),i_00);
        (*ppIVar2)->ConfigData = (ImFontConfig *)0x0;
        ppIVar2 = ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)(in_RDI + 0x40),i_00);
        (*ppIVar2)->ConfigDataCount = 0;
      }
    }
  }
  ImVector<ImFontConfig>::clear((ImVector<ImFontConfig> *)CONCAT44(i_01,i_00));
  ImVector<ImFontAtlasCustomRect>::clear((ImVector<ImFontAtlasCustomRect> *)CONCAT44(i_01,i_00));
  *(undefined4 *)(in_RDI + 0x480) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x47c) = 0xffffffff;
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < ConfigData.Size; i++)
        if (ConfigData[i].FontData && ConfigData[i].FontDataOwnedByAtlas)
        {
            IM_FREE(ConfigData[i].FontData);
            ConfigData[i].FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (int i = 0; i < Fonts.Size; i++)
        if (Fonts[i]->ConfigData >= ConfigData.Data && Fonts[i]->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            Fonts[i]->ConfigData = NULL;
            Fonts[i]->ConfigDataCount = 0;
        }
    ConfigData.clear();
    CustomRects.clear();
    PackIdMouseCursors = PackIdLines = -1;
}